

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O3

idx_t duckdb::TernaryExecutor::
      SelectLoopSelSwitch<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::ExclusiveBetweenOperator,false>
                (UnifiedVectorFormat *adata,UnifiedVectorFormat *bdata,UnifiedVectorFormat *cdata,
                SelectionVector *sel,idx_t count,SelectionVector *true_sel,
                SelectionVector *false_sel)

{
  SelectionVector *pSVar1;
  data_ptr_t pdVar2;
  SelectionVector *pSVar3;
  data_ptr_t pdVar4;
  SelectionVector *pSVar5;
  data_ptr_t pdVar6;
  sel_t *psVar7;
  sel_t *psVar8;
  sel_t *psVar9;
  sel_t *psVar10;
  unsigned_long *puVar11;
  unsigned_long *puVar12;
  unsigned_long *puVar13;
  sel_t *psVar14;
  sel_t *psVar15;
  long lVar16;
  long lVar17;
  idx_t iVar18;
  ulong uVar19;
  bool bVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  idx_t iVar24;
  idx_t iVar25;
  ulong uVar26;
  idx_t iVar27;
  ulong uVar28;
  idx_t iVar29;
  idx_t iVar30;
  
  pSVar1 = adata->sel;
  pdVar2 = adata->data;
  pSVar3 = bdata->sel;
  pdVar4 = bdata->data;
  pSVar5 = cdata->sel;
  pdVar6 = cdata->data;
  if (false_sel == (SelectionVector *)0x0 || true_sel == (SelectionVector *)0x0) {
    if (true_sel == (SelectionVector *)0x0) {
      if (count == 0) {
        lVar23 = 0;
      }
      else {
        psVar7 = sel->sel_vector;
        psVar8 = pSVar1->sel_vector;
        psVar9 = pSVar3->sel_vector;
        psVar10 = pSVar5->sel_vector;
        puVar11 = (adata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar12 = (bdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar13 = (cdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar14 = false_sel->sel_vector;
        lVar23 = 0;
        iVar18 = 0;
        do {
          iVar29 = iVar18;
          if (psVar7 != (sel_t *)0x0) {
            iVar29 = (idx_t)psVar7[iVar18];
          }
          iVar27 = iVar18;
          if (psVar8 != (sel_t *)0x0) {
            iVar27 = (idx_t)psVar8[iVar18];
          }
          iVar25 = iVar18;
          if (psVar9 != (sel_t *)0x0) {
            iVar25 = (idx_t)psVar9[iVar18];
          }
          iVar30 = iVar18;
          if (psVar10 != (sel_t *)0x0) {
            iVar30 = (idx_t)psVar10[iVar18];
          }
          if ((((puVar11 == (unsigned_long *)0x0) ||
               ((puVar11[iVar27 >> 6] >> (iVar27 & 0x3f) & 1) != 0)) &&
              ((puVar12 == (unsigned_long *)0x0 ||
               ((puVar12[iVar25 >> 6] >> (iVar25 & 0x3f) & 1) != 0)))) &&
             ((puVar13 == (unsigned_long *)0x0 ||
              ((puVar13[iVar30 >> 6] >> (iVar30 & 0x3f) & 1) != 0)))) {
            lVar16 = *(long *)(pdVar2 + iVar27 * 0x10 + 8);
            if ((*(long *)(pdVar4 + iVar25 * 0x10 + 8) < lVar16) ||
               (uVar22 = 1,
               *(ulong *)(pdVar4 + iVar25 * 0x10) < *(ulong *)(pdVar2 + iVar27 * 0x10) &&
               lVar16 == *(long *)(pdVar4 + iVar25 * 0x10 + 8))) {
              uVar22 = (ulong)((*(ulong *)(pdVar6 + iVar30 * 0x10) <=
                                *(ulong *)(pdVar2 + iVar27 * 0x10) ||
                               *(long *)(pdVar6 + iVar30 * 0x10 + 8) != lVar16) &&
                              *(long *)(pdVar6 + iVar30 * 0x10 + 8) <= lVar16);
            }
          }
          else {
            uVar22 = 1;
          }
          psVar14[lVar23] = (sel_t)iVar29;
          lVar23 = lVar23 + uVar22;
          iVar18 = iVar18 + 1;
        } while (count != iVar18);
      }
      return count - lVar23;
    }
    if (count != 0) {
      psVar7 = sel->sel_vector;
      psVar8 = pSVar1->sel_vector;
      psVar9 = pSVar3->sel_vector;
      psVar10 = pSVar5->sel_vector;
      puVar11 = (adata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      puVar12 = (bdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      puVar13 = (cdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      psVar14 = true_sel->sel_vector;
      iVar18 = 0;
      iVar29 = 0;
      do {
        iVar27 = iVar29;
        if (psVar7 != (sel_t *)0x0) {
          iVar27 = (idx_t)psVar7[iVar29];
        }
        iVar25 = iVar29;
        if (psVar8 != (sel_t *)0x0) {
          iVar25 = (idx_t)psVar8[iVar29];
        }
        iVar30 = iVar29;
        if (psVar9 != (sel_t *)0x0) {
          iVar30 = (idx_t)psVar9[iVar29];
        }
        iVar24 = iVar29;
        if (psVar10 != (sel_t *)0x0) {
          iVar24 = (idx_t)psVar10[iVar29];
        }
        if ((((puVar11 == (unsigned_long *)0x0) ||
             ((puVar11[iVar25 >> 6] >> (iVar25 & 0x3f) & 1) != 0)) &&
            ((puVar12 == (unsigned_long *)0x0 ||
             ((puVar12[iVar30 >> 6] >> (iVar30 & 0x3f) & 1) != 0)))) &&
           ((puVar13 == (unsigned_long *)0x0 || ((puVar13[iVar24 >> 6] >> (iVar24 & 0x3f) & 1) != 0)
            ))) {
          lVar23 = *(long *)(pdVar2 + iVar25 * 0x10 + 8);
          if ((*(long *)(pdVar4 + iVar30 * 0x10 + 8) < lVar23) ||
             (*(ulong *)(pdVar4 + iVar30 * 0x10) < *(ulong *)(pdVar2 + iVar25 * 0x10) &&
              lVar23 == *(long *)(pdVar4 + iVar30 * 0x10 + 8))) {
            lVar16 = *(long *)(pdVar6 + iVar24 * 0x10 + 8);
            uVar22 = (ulong)(*(ulong *)(pdVar2 + iVar25 * 0x10) < *(ulong *)(pdVar6 + iVar24 * 0x10)
                             && lVar16 == lVar23 || lVar16 != lVar23 && lVar23 <= lVar16);
          }
          else {
            uVar22 = 0;
          }
        }
        else {
          uVar22 = 0;
        }
        psVar14[iVar18] = (sel_t)iVar27;
        iVar18 = iVar18 + uVar22;
        iVar29 = iVar29 + 1;
      } while (count != iVar29);
      return iVar18;
    }
  }
  else if (count != 0) {
    psVar7 = sel->sel_vector;
    psVar8 = pSVar1->sel_vector;
    psVar9 = pSVar3->sel_vector;
    psVar10 = pSVar5->sel_vector;
    puVar11 = (adata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    puVar12 = (bdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    puVar13 = (cdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    psVar14 = true_sel->sel_vector;
    psVar15 = false_sel->sel_vector;
    iVar18 = 0;
    lVar23 = 0;
    uVar22 = 0;
    do {
      uVar26 = uVar22;
      if (psVar7 != (sel_t *)0x0) {
        uVar26 = (ulong)psVar7[uVar22];
      }
      uVar28 = uVar22;
      if (psVar8 != (sel_t *)0x0) {
        uVar28 = (ulong)psVar8[uVar22];
      }
      uVar19 = uVar22;
      if (psVar9 != (sel_t *)0x0) {
        uVar19 = (ulong)psVar9[uVar22];
      }
      uVar21 = uVar22;
      if (psVar10 != (sel_t *)0x0) {
        uVar21 = (ulong)psVar10[uVar22];
      }
      if ((((puVar11 == (unsigned_long *)0x0) ||
           ((puVar11[uVar28 >> 6] >> (uVar28 & 0x3f) & 1) != 0)) &&
          ((puVar12 == (unsigned_long *)0x0 || ((puVar12[uVar19 >> 6] >> (uVar19 & 0x3f) & 1) != 0))
          )) && ((puVar13 == (unsigned_long *)0x0 ||
                 ((puVar13[uVar21 >> 6] >> (uVar21 & 0x3f) & 1) != 0)))) {
        lVar16 = *(long *)(pdVar2 + uVar28 * 0x10 + 8);
        if ((*(long *)(pdVar4 + uVar19 * 0x10 + 8) < lVar16) ||
           (*(ulong *)(pdVar4 + uVar19 * 0x10) < *(ulong *)(pdVar2 + uVar28 * 0x10) &&
            lVar16 == *(long *)(pdVar4 + uVar19 * 0x10 + 8))) {
          lVar17 = *(long *)(pdVar6 + uVar21 * 0x10 + 8);
          bVar20 = *(ulong *)(pdVar2 + uVar28 * 0x10) < *(ulong *)(pdVar6 + uVar21 * 0x10) &&
                   lVar17 == lVar16 || lVar17 != lVar16 && lVar16 <= lVar17;
        }
        else {
          bVar20 = false;
        }
      }
      else {
        bVar20 = false;
      }
      psVar14[iVar18] = (sel_t)uVar26;
      iVar18 = iVar18 + bVar20;
      psVar15[lVar23] = (sel_t)uVar26;
      lVar23 = lVar23 + (ulong)(bVar20 ^ 1);
      uVar22 = uVar22 + 1;
    } while (count != uVar22);
    return iVar18;
  }
  return 0;
}

Assistant:

static inline idx_t SelectLoopSelSwitch(UnifiedVectorFormat &adata, UnifiedVectorFormat &bdata,
	                                        UnifiedVectorFormat &cdata, const SelectionVector *sel, idx_t count,
	                                        SelectionVector *true_sel, SelectionVector *false_sel) {
		if (true_sel && false_sel) {
			return SelectLoop<A_TYPE, B_TYPE, C_TYPE, OP, NO_NULL, true, true>(
			    UnifiedVectorFormat::GetData<A_TYPE>(adata), UnifiedVectorFormat::GetData<B_TYPE>(bdata),
			    UnifiedVectorFormat::GetData<C_TYPE>(cdata), sel, count, *adata.sel, *bdata.sel, *cdata.sel,
			    adata.validity, bdata.validity, cdata.validity, true_sel, false_sel);
		} else if (true_sel) {
			return SelectLoop<A_TYPE, B_TYPE, C_TYPE, OP, NO_NULL, true, false>(
			    UnifiedVectorFormat::GetData<A_TYPE>(adata), UnifiedVectorFormat::GetData<B_TYPE>(bdata),
			    UnifiedVectorFormat::GetData<C_TYPE>(cdata), sel, count, *adata.sel, *bdata.sel, *cdata.sel,
			    adata.validity, bdata.validity, cdata.validity, true_sel, false_sel);
		} else {
			D_ASSERT(false_sel);
			return SelectLoop<A_TYPE, B_TYPE, C_TYPE, OP, NO_NULL, false, true>(
			    UnifiedVectorFormat::GetData<A_TYPE>(adata), UnifiedVectorFormat::GetData<B_TYPE>(bdata),
			    UnifiedVectorFormat::GetData<C_TYPE>(cdata), sel, count, *adata.sel, *bdata.sel, *cdata.sel,
			    adata.validity, bdata.validity, cdata.validity, true_sel, false_sel);
		}
	}